

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_float_convert.cpp
# Opt level: O3

double local_float_convert::get_random_float<double,_1,75>(void)

{
  result_type_conflict2 rVar1;
  result_type rVar2;
  double dVar3;
  double dVar4;
  
  if (get_random_float<double,-1,75>()::dist_man == '\0') {
    get_random_float<double,_1,75>();
  }
  if (get_random_float<double,-1,75>()::dist_sgn == '\0') {
    get_random_float<double,_1,75>();
  }
  if (get_random_float<double,-1,75>()::dist_e10 == '\0') {
    get_random_float<double,_1,75>();
  }
  engine_e10();
  rVar1 = std::uniform_int_distribution<int>::operator()
                    (&get_random_float<double,_-1,_75>::dist_e10,&engine_e10::my_engine_e10,
                     &get_random_float<double,_-1,_75>::dist_e10._M_param);
  dVar3 = pow(10.0,(double)rVar1);
  engine_man();
  dVar4 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (&engine_man::my_engine_man);
  dVar3 = ((get_random_float<double,_-1,_75>::dist_man._M_param._M_b -
           get_random_float<double,_-1,_75>::dist_man._M_param._M_a) * dVar4 +
          get_random_float<double,_-1,_75>::dist_man._M_param._M_a) * dVar3;
  engine_sgn();
  rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                    (&get_random_float<double,_-1,_75>::dist_sgn,&engine_sgn::my_engine_sgn,
                     &get_random_float<double,_-1,_75>::dist_sgn._M_param);
  if (rVar2 != 0) {
    dVar3 = -dVar3;
  }
  return dVar3;
}

Assistant:

auto get_random_float() -> FloatingPointType
  {
    using local_builtin_float_type = FloatingPointType;

    static std::uniform_real_distribution<local_builtin_float_type>
    dist_man
    (
      static_cast<local_builtin_float_type>(0.0F),
      static_cast<local_builtin_float_type>(1.0F)
    );

    static auto dist_sgn = unsigned_dist_maker(static_cast<unsigned>(UINT8_C(0)),
                                               static_cast<unsigned>(UINT8_C(1)));

    static auto dist_e10 = unsigned_dist_maker(LoExp10, HiExp10);

    using std::pow;

    const auto p10 = dist_e10(engine_e10());

    const local_builtin_float_type e10 = pow(static_cast<local_builtin_float_type>(10.0F),
                                             static_cast<local_builtin_float_type>(p10));

    const local_builtin_float_type a = dist_man(engine_man()) * e10;

    const bool is_neg = (dist_sgn(engine_sgn()) != 0);

    const local_builtin_float_type f = ((!is_neg) ? a : -a);

    return f;
  }